

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

wchar_t * create_expanded_text(wchar_t *original_text,TableRow *example_header,TableRow *body_row)

{
  QueueItem *pQVar1;
  item_delete_function __s;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  ItemQueue *item_queue;
  size_t sVar5;
  size_t sVar6;
  Item *pIVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ItemQueue *pIVar15;
  wchar_t j;
  long lVar16;
  
  uVar14 = 0;
  item_queue = ItemQueue_new();
  sVar5 = wcslen(original_text);
  iVar3 = (int)sVar5;
  uVar10 = 0;
  if (0 < iVar3) {
    uVar10 = sVar5 & 0xffffffff;
  }
  for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
    if (original_text[uVar14] == L'<') {
      lVar11 = 0x18;
      for (lVar16 = 0; lVar16 < example_header->table_cells->cell_count; lVar16 = lVar16 + 1) {
        pwVar8 = *(wchar_t **)
                  ((long)&example_header->table_cells->table_cells->cell_delete + lVar11);
        sVar6 = wcslen(pwVar8);
        iVar13 = (int)sVar6;
        if ((iVar13 < (int)(~(uint)uVar14 + iVar3)) &&
           (iVar4 = wcsncmp(original_text + uVar14 + 1,pwVar8,(long)iVar13), iVar4 == 0)) {
          pIVar7 = (Item *)malloc(0x18);
          pIVar7->item_delete = ReplacementItem_delete;
          *(uint *)&pIVar7[1].item_delete = (uint)uVar14;
          *(int *)((long)&pIVar7[1].item_delete + 4) = iVar13 + 2;
          pIVar7[2].item_delete =
               *(item_delete_function *)
                ((long)&body_row->table_cells->table_cells->cell_delete + lVar11);
          ItemQueue_add(item_queue,pIVar7);
        }
        lVar11 = lVar11 + 0x20;
      }
    }
  }
  _Var2 = ItemQueue_is_empty(item_queue);
  if (_Var2) {
    pwVar8 = (wchar_t *)malloc((long)((sVar5 << 0x20) + 0x100000000) >> 0x1e);
    wmemcpy(pwVar8,original_text,(long)iVar3);
    pwVar9 = pwVar8 + iVar3;
  }
  else {
    uVar10 = sVar5 & 0xffffffff;
    pIVar15 = item_queue;
    while( true ) {
      pQVar1 = pIVar15->first;
      iVar13 = (int)uVar10;
      if (pQVar1 == (QueueItem *)0x0) break;
      pIVar7 = pQVar1->item;
      sVar5 = wcslen((wchar_t *)pIVar7[2].item_delete);
      uVar10 = (ulong)(uint)((iVar13 - *(int *)((long)&pIVar7[1].item_delete + 4)) + (int)sVar5);
      pIVar15 = (ItemQueue *)&pQVar1->next;
    }
    pwVar8 = (wchar_t *)malloc((long)iVar13 * 4 + 4);
    iVar12 = 0;
    iVar4 = 0;
    while( true ) {
      _Var2 = ItemQueue_is_empty(item_queue);
      lVar11 = (long)iVar12;
      if (_Var2) break;
      pIVar7 = ItemQueue_remove(item_queue);
      wmemcpy(pwVar8 + iVar4,original_text + lVar11,*(int *)&pIVar7[1].item_delete - lVar11);
      iVar4 = iVar4 + (*(int *)&pIVar7[1].item_delete - iVar12);
      __s = pIVar7[2].item_delete;
      sVar5 = wcslen((wchar_t *)__s);
      wmemcpy(pwVar8 + iVar4,(wchar_t *)__s,sVar5);
      sVar5 = wcslen((wchar_t *)pIVar7[2].item_delete);
      iVar4 = iVar4 + (int)sVar5;
      iVar12 = *(int *)((long)&pIVar7[1].item_delete + 4) + *(int *)&pIVar7[1].item_delete;
      free(pIVar7);
    }
    if (iVar3 - iVar12 != 0 && iVar12 <= iVar3) {
      wmemcpy(pwVar8 + iVar4,original_text + lVar11,(long)(iVar3 - iVar12));
    }
    pwVar9 = pwVar8 + iVar13;
  }
  *pwVar9 = L'\0';
  ItemQueue_delete(item_queue);
  return pwVar8;
}

Assistant:

static const wchar_t* create_expanded_text(const wchar_t* original_text, const TableRow* example_header, const TableRow* body_row) {
    ItemQueue* replacement_list = ItemQueue_new();
    int length = wcslen(original_text);
    int i;
    for (i = 0; i < length; ++i) {
        if (original_text[i] == L'<') {
            int j;
            for (j = 0; j < example_header->table_cells->cell_count; ++j) {
                int cell_text_length = wcslen(example_header->table_cells->table_cells[j].value);
                if (cell_text_length < length - i - 1 &&
                        wcsncmp(original_text + i + 1, example_header->table_cells->table_cells[j].value, cell_text_length) == 0) {
                    ReplacementItem* item = (ReplacementItem*)malloc(sizeof(ReplacementItem));
                    item->item_delete = (item_delete_function)ReplacementItem_delete;
                    item->start_position = i;
                    item->old_length = cell_text_length + 2;
                    item->new_text = body_row->table_cells->table_cells[j].value;
                    ItemQueue_add(replacement_list, (Item*)item);
                }
            }
        }
    }
    wchar_t* text;
    if (ItemQueue_is_empty(replacement_list)) {
        text = (wchar_t*)malloc((length + 1) * sizeof(wchar_t));
        wmemcpy(text, original_text, length);
        text[length] = L'\0';
    }
    else {
        int new_text_length = length;
        QueueItem* queue_item = replacement_list->first;
        while (queue_item) {
            ReplacementItem* item = (ReplacementItem*)queue_item->item;
            new_text_length += wcslen(item->new_text) - item->old_length;
            queue_item = queue_item->next;
        }
        text = (wchar_t*)malloc((new_text_length + 1) * sizeof(wchar_t));
        int current_src_pos = 0;
        int current_dest_pos = 0;
        while (!ItemQueue_is_empty(replacement_list)) {
            ReplacementItem* item = (ReplacementItem*)ItemQueue_remove(replacement_list);
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, item->start_position - current_src_pos);
            current_dest_pos += item->start_position - current_src_pos;
            wmemcpy(text + current_dest_pos, item->new_text, wcslen(item->new_text));
            current_dest_pos += wcslen(item->new_text);
            current_src_pos += item->start_position - current_src_pos + item->old_length;
            ReplacementItem_delete(item);
        }
        if (current_src_pos < length) {
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, length - current_src_pos);
        }
        text[new_text_length] = L'\0';
    }
    ItemQueue_delete(replacement_list);
    return text;
}